

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnElse(TypeChecker *this)

{
  LabelType LVar1;
  pointer pTVar2;
  Result RVar3;
  Enum EVar4;
  Result RVar5;
  Label *in_RAX;
  pointer pTVar6;
  Label *label;
  Label *local_38;
  
  local_38 = in_RAX;
  RVar3 = GetLabel(this,0,&local_38);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    LVar1 = local_38->label_type;
    RVar3 = PopAndCheckSignature(this,&local_38->result_types,"if true branch");
    RVar5 = CheckTypeStackEnd(this,"if true branch");
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
              (&this->type_stack_,local_38->type_stack_limit);
    pTVar2 = (local_38->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar6 = (local_38->param_types).
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start; pTVar6 != pTVar2; pTVar6 = pTVar6 + 1) {
      PushType(this,(Type)pTVar6->enum_);
    }
    EVar4 = (Enum)((RVar5.enum_ == Error || RVar3.enum_ == Error) || LVar1 != If);
    local_38->label_type = Else;
    local_38->unreachable = false;
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnElse() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::If);
  result |= PopAndCheckSignature(label->result_types, "if true branch");
  result |= CheckTypeStackEnd("if true branch");
  ResetTypeStackToLabel(label);
  PushTypes(label->param_types);
  label->label_type = LabelType::Else;
  label->unreachable = false;
  return result;
}